

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZElementMatrixT<double> *ek,
          TPZElementMatrixT<double> *ef)

{
  long lVar1;
  TPZElementMatrixT<double> *pTVar2;
  int64_t iVar3;
  _func_int **pp_Var4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  TPZIntPoints *rval;
  uint uVar11;
  long lVar12;
  long lVar13;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this_00;
  TPZCompElSide *pTVar14;
  int *piVar15;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_4> intorder;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_6> datavec;
  TPZAutoPointer<TPZIntPoints> TStack_32070;
  int iStack_32064;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *pTStack_32060;
  double dStack_32058;
  TPZElementMatrixT<double> *pTStack_32050;
  TPZElementMatrixT<double> *pTStack_32048;
  TPZGeoEl *pTStack_32040;
  long *plStack_32038;
  TPZManVector<int,_4> TStack_32030;
  _func_int **pp_Stack_32000;
  double dStack_31ff8;
  TPZVec<double> TStack_31ff0;
  double adStack_31fd0 [4];
  TPZManVector<int,_4> TStack_31fb0;
  TPZFMatrix<double> TStack_31f80;
  TPZFMatrix<double> TStack_31ef0;
  TPZFMatrix<double> TStack_31e60;
  TPZManVector<TPZTransform<double>,_10> TStack_31dd0;
  TPZManVector<TPZMaterialDataT<double>,_6> TStack_30d70;
  
  lVar9 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar9 != 0) {
    plStack_32038 =
         (long *)__dynamic_cast(lVar9,&TPZMaterial::typeinfo,
                                &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
    if (plStack_32038 != (long *)0x0) {
      lVar9 = __dynamic_cast(lVar9,&TPZMaterial::typeinfo,&TPZNullMaterialCS<double>::typeinfo,0);
      if (lVar9 == 0) {
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xf8))
                  (this,ek,ef);
        iVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                          (this);
        if (iVar5 != 0) {
          TPZManVector<TPZMaterialDataT<double>,_6>::TPZManVector(&TStack_30d70,0);
          lVar9 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
          (*TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])
                    (&TStack_30d70,lVar9);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
                    (this,&TStack_30d70,0);
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_31dd0,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this);
          iVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0
                              ))(this);
          TStack_32070.fRef = (TPZReference *)operator_new(0x10);
          ((TStack_32070.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
          (TStack_32070.fRef)->fPointer = (TPZIntPoints *)0x0;
          LOCK();
          ((TStack_32070.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
          UNLOCK();
          TPZVec<double>::TPZVec(&TStack_31ff0,0);
          TStack_31ff0.fStore = adStack_31fd0;
          TStack_31ff0._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0187b960;
          TStack_31ff0.fNElements = 3;
          TStack_31ff0.fNAlloc = 0;
          adStack_31fd0[0] = 0.0;
          adStack_31fd0[1] = 0.0;
          adStack_31fd0[2] = 0.0;
          dStack_32058 = 0.0;
          pTStack_32060 = this;
          pTStack_32050 = ef;
          pTStack_32048 = ek;
          TPZVec<int>::TPZVec(&TStack_32030.super_TPZVec<int>,0);
          TStack_32030.super_TPZVec<int>.fStore = TStack_32030.fExtAlloc;
          TStack_32030.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018bdaf8;
          TStack_32030.super_TPZVec<int>.fNElements = 0;
          TStack_32030.super_TPZVec<int>.fNAlloc = 0;
          if (0 < lVar9) {
            lVar13 = 17000;
            lVar12 = 0;
            do {
              lVar1 = *(long *)((long)&((pTStack_32060->fElementVec).super_TPZVec<TPZCompElSide>.
                                       fStore)->fEl + lVar12);
              if (lVar1 != 0) {
                plVar10 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                                 &TPZInterpolationSpace::typeinfo,0);
                if (plVar10 != (long *)0x0) {
                  TPZManVector<int,_4>::Resize
                            (&TStack_32030,TStack_32030.super_TPZVec<int>.fNElements + 1);
                  iVar3 = TStack_32030.super_TPZVec<int>.fNElements;
                  uVar6 = (**(code **)(*plVar10 + 0x268))(plVar10);
                  *(undefined4 *)
                   ((long)((TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                          super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
                   lVar13 + -0x30) = uVar6;
                  *(undefined4 *)
                   ((long)TStack_32030.super_TPZVec<int>.fStore +
                   ((iVar3 << 0x20) + -0x100000000 >> 0x1e)) = uVar6;
                }
              }
              lVar12 = lVar12 + 0x10;
              lVar13 = lVar13 + 0x8230;
              lVar9 = lVar9 + -1;
            } while (lVar9 != 0);
          }
          iStack_32064 = (**(code **)(*plStack_32038 + 0x48))(plStack_32038,&TStack_32030);
          this_00 = pTStack_32060;
          pTStack_32040 = TPZCompEl::Reference((TPZCompEl *)pTStack_32060);
          pTVar2 = pTStack_32048;
          iVar7 = (**(code **)(*(long *)pTStack_32040 + 0xf0))();
          rval = (TPZIntPoints *)
                 (**(code **)(*(long *)pTStack_32040 + 0x70))(pTStack_32040,iVar7 + -1,iStack_32064)
          ;
          TPZAutoPointer<TPZIntPoints>::operator=(&TStack_32070,rval);
          TPZManVector<int,_4>::TPZManVector(&TStack_31fb0,(long)iVar5,&iStack_32064);
          (*(TStack_32070.fRef)->fPointer->_vptr_TPZIntPoints[5])
                    ((TStack_32070.fRef)->fPointer,&TStack_31fb0,0);
          uVar8 = (*(TStack_32070.fRef)->fPointer->_vptr_TPZIntPoints[3])();
          if (1000 < (int)uVar8) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                       ,0x36d);
          }
          TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_31e60.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_31e60.fElem = (double *)0x0;
          TStack_31e60.fGiven = (double *)0x0;
          TStack_31e60.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_31e60.fPivot.super_TPZVec<int>,0);
          TStack_31e60.fPivot.super_TPZVec<int>.fStore = TStack_31e60.fPivot.fExtAlloc;
          TStack_31e60.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_31e60.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_31e60.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_31e60.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_31e60.fWork.fStore = (double *)0x0;
          TStack_31e60.fWork.fNElements = 0;
          TStack_31e60.fWork.fNAlloc = 0;
          TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_31ef0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_31ef0.fElem = (double *)0x0;
          TStack_31ef0.fGiven = (double *)0x0;
          TStack_31ef0.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_31ef0.fPivot.super_TPZVec<int>,0);
          TStack_31ef0.fPivot.super_TPZVec<int>.fStore = TStack_31ef0.fPivot.fExtAlloc;
          TStack_31ef0.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_31ef0.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_31ef0.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_31ef0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_31ef0.fWork.fStore = (double *)0x0;
          TStack_31ef0.fWork.fNElements = 0;
          TStack_31ef0.fWork.fNAlloc = 0;
          TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_31f80.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_018151d8;
          TStack_31f80.fElem = (double *)0x0;
          TStack_31f80.fGiven = (double *)0x0;
          TStack_31f80.fSize = 0;
          TPZVec<int>::TPZVec(&TStack_31f80.fPivot.super_TPZVec<int>,0);
          TStack_31f80.fPivot.super_TPZVec<int>.fStore = TStack_31f80.fPivot.fExtAlloc;
          TStack_31f80.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_31f80.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_31f80.fPivot.super_TPZVec<int>.fNAlloc = 0;
          pp_Stack_32000 = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_31f80.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_31f80.fWork.fStore = (double *)0x0;
          TStack_31f80.fWork.fNElements = 0;
          TStack_31f80.fWork.fNAlloc = 0;
          if (0 < (int)uVar8) {
            pTStack_32048 = (TPZElementMatrixT<double> *)&pTVar2->fMat;
            pTStack_32050 = (TPZElementMatrixT<double> *)&pTStack_32050->fMat;
            uVar11 = 0;
            do {
              (*(TStack_32070.fRef)->fPointer->_vptr_TPZIntPoints[4])
                        ((TStack_32070.fRef)->fPointer,(ulong)uVar11,&TStack_31ff0,&dStack_32058);
              TPZGeoEl::Jacobian(pTStack_32040,&TStack_31ff0,&TStack_31e60,&TStack_31ef0,
                                 &dStack_31ff8,&TStack_31f80);
              dStack_32058 = ABS(dStack_31ff8) * dStack_32058;
              lVar9 = (this_00->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
              if (0 < lVar9) {
                pTVar14 = (pTStack_32060->fElementVec).super_TPZVec<TPZCompElSide>.fStore;
                piVar15 = &((TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                           super_TPZMaterialData).intLocPtIndex;
                do {
                  if (pTVar14->fEl != (TPZCompEl *)0x0) {
                    lVar12 = __dynamic_cast(pTVar14->fEl,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
                    if (lVar12 != 0) {
                      *piVar15 = uVar11;
                    }
                  }
                  piVar15 = piVar15 + 0x208c;
                  pTVar14 = pTVar14 + 1;
                  lVar9 = lVar9 + -1;
                } while (lVar9 != 0);
              }
              this_00 = pTStack_32060;
              (**(code **)(*(long *)&(pTStack_32060->super_TPZMultiphysicsElement).super_TPZCompEl +
                          0x2a8))(pTStack_32060,&TStack_31ff0,&TStack_31dd0,&TStack_30d70);
              (**(code **)(*plStack_32038 + 0x68))
                        (dStack_32058,plStack_32038,&TStack_30d70,pTStack_32048,pTStack_32050);
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar8);
          }
          CleanupMaterialDataT<double>
                    (this_00,&TStack_30d70.super_TPZVec<TPZMaterialDataT<double>_>);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_31f80);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_31ef0);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_31e60);
          if (TStack_31fb0.super_TPZVec<int>.fStore != TStack_31fb0.fExtAlloc) {
            TStack_31fb0.super_TPZVec<int>.fNAlloc = 0;
            TStack_31fb0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_31fb0.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_31fb0.super_TPZVec<int>.fStore);
            }
          }
          pp_Var4 = pp_Stack_32000;
          if (TStack_32030.super_TPZVec<int>.fStore != TStack_32030.fExtAlloc) {
            TStack_32030.super_TPZVec<int>.fNAlloc = 0;
            TStack_32030.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_32030.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_32030.super_TPZVec<int>.fStore);
            }
          }
          if (TStack_31ff0.fStore != adStack_31fd0) {
            TStack_31ff0.fNAlloc = 0;
            TStack_31ff0._vptr_TPZVec = pp_Var4;
            if (TStack_31ff0.fStore != (double *)0x0) {
              operator_delete__(TStack_31ff0.fStore);
            }
          }
          TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_32070);
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_31dd0);
          TPZManVector<TPZMaterialDataT<double>,_6>::~TPZManVector(&TStack_30d70);
        }
      }
      else {
        TPZElementMatrixT<double>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
        TPZElementMatrixT<double>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
        (ek->super_TPZElementMatrix).fType = EK;
        (ef->super_TPZElementMatrix).fType = EF;
      }
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoCube, TVar = double]"
             ,0xa0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," this->Material() == NULL\n",0x1a);
  TPZElementMatrixT<double>::Reset(ek,(TPZCompMesh *)0x0,Unknown);
  TPZElementMatrixT<double>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}